

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O1

void __thiscall QGraphicsLayoutItem::~QGraphicsLayoutItem(QGraphicsLayoutItem *this)

{
  QGraphicsLayoutItem *pQVar1;
  QGraphicsLayoutItemPrivate *pQVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  QGraphicsLayout *lay;
  
  this->_vptr_QGraphicsLayoutItem = (_func_int **)&PTR__QGraphicsLayoutItem_00820fd0;
  pQVar1 = ((this->d_ptr).d)->parent;
  if ((pQVar1 != (QGraphicsLayoutItem *)0x0) && ((((pQVar1->d_ptr).d)->field_0xb0 & 4) != 0)) {
    uVar3 = (*pQVar1->_vptr_QGraphicsLayoutItem[9])(pQVar1);
    do {
      if ((int)uVar3 < 1) goto LAB_006045bd;
      uVar3 = uVar3 - 1;
      iVar4 = (*pQVar1->_vptr_QGraphicsLayoutItem[10])(pQVar1,(ulong)uVar3);
    } while ((QGraphicsLayoutItem *)CONCAT44(extraout_var,iVar4) != this);
    (*pQVar1->_vptr_QGraphicsLayoutItem[0xb])(pQVar1,(ulong)uVar3);
  }
LAB_006045bd:
  pQVar2 = (this->d_ptr).d;
  if (pQVar2 != (QGraphicsLayoutItemPrivate *)0x0) {
    (*pQVar2->_vptr_QGraphicsLayoutItemPrivate[1])();
    return;
  }
  return;
}

Assistant:

QGraphicsLayoutItem::~QGraphicsLayoutItem()
{
    QGraphicsLayoutItem *parentLI = parentLayoutItem();
    if (parentLI && parentLI->isLayout()) {
        QGraphicsLayout *lay = static_cast<QGraphicsLayout*>(parentLI);
        // this is not optimal
        for (int i = lay->count() - 1; i >= 0; --i) {
            if (lay->itemAt(i) == this) {
                lay->removeAt(i);
                break;
            }
        }
    }
}